

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O2

value_type __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
get_node_count<(unodb::node_type)0>
          (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  value_type vVar1;
  
  std::mutex::lock(&this->mutex);
  vVar1 = (this->db_).node_counts._M_elems[0];
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return vVar1;
}

Assistant:

[[nodiscard]] auto get_node_count() const {
    const std::lock_guard guard{mutex};
    return db_.template get_node_count<NodeType>();
  }